

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswAig.c
# Opt level: O0

Aig_Man_t * Ssw_FramesWithClasses(Ssw_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *p_00;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *p1;
  bool local_91;
  int local_44;
  int local_40;
  int iLits;
  int f;
  int i;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Aig_Man_t *pFrames;
  Ssw_Man_t *p_local;
  
  if (p->pFrames != (Aig_Man_t *)0x0) {
    __assert_fail("p->pFrames == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0x95,"Aig_Man_t *Ssw_FramesWithClasses(Ssw_Man_t *)");
  }
  iVar2 = Aig_ManRegNum(p->pAig);
  if (iVar2 < 1) {
    __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0x96,"Aig_Man_t *Ssw_FramesWithClasses(Ssw_Man_t *)");
  }
  iVar2 = Aig_ManRegNum(p->pAig);
  iVar3 = Aig_ManCiNum(p->pAig);
  if (iVar3 <= iVar2) {
    __assert_fail("Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0x97,"Aig_Man_t *Ssw_FramesWithClasses(Ssw_Man_t *)");
  }
  p->nConstrReduced = 0;
  p->nConstrTotal = 0;
  iVar2 = Aig_ManObjNumMax(p->pAig);
  p_00 = Aig_ManStart(iVar2 * p->nFrames);
  for (iLits = 0; iVar2 = Saig_ManRegNum(p->pAig), iLits < iVar2; iLits = iLits + 1) {
    pVVar1 = p->pAig->vCis;
    iVar2 = Saig_ManPiNum(p->pAig);
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,iLits + iVar2);
    pAVar5 = Aig_ObjCreateCi(p_00);
    Ssw_ObjSetFrame(p,pAVar4,0,pAVar5);
  }
  local_44 = 0;
  for (local_40 = 0; local_40 < p->pPars->nFramesK; local_40 = local_40 + 1) {
    pAVar4 = Aig_ManConst1(p->pAig);
    pAVar5 = Aig_ManConst1(p_00);
    Ssw_ObjSetFrame(p,pAVar4,local_40,pAVar5);
    for (iLits = 0; iVar2 = Saig_ManPiNum(p->pAig), iLits < iVar2; iLits = iLits + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,iLits);
      pAVar5 = Aig_ObjCreateCi(p_00);
      local_91 = false;
      if (p->vInits != (Vec_Int_t *)0x0) {
        iVar2 = Vec_IntEntry(p->vInits,local_44);
        local_91 = iVar2 != 0;
        local_44 = local_44 + 1;
      }
      *(ulong *)&pAVar5->field_0x18 =
           *(ulong *)&pAVar5->field_0x18 & 0xfffffffffffffff7 | (ulong)local_91 << 3;
      Ssw_ObjSetFrame(p,pAVar4,local_40,pAVar5);
    }
    for (iLits = 0; iVar2 = Saig_ManRegNum(p->pAig), iLits < iVar2; iLits = iLits + 1) {
      pVVar1 = p->pAig->vCis;
      iVar2 = Saig_ManPiNum(p->pAig);
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,iLits + iVar2);
      Ssw_FramesConstrainNode(p,p_00,p->pAig,pAVar4,local_40,1);
    }
    for (iLits = 0; iVar2 = Vec_PtrSize(p->pAig->vObjs), iLits < iVar2; iLits = iLits + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,iLits);
      if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar4), iVar2 != 0)) {
        pAVar5 = Ssw_ObjChild0Fra(p,pAVar4,local_40);
        p1 = Ssw_ObjChild1Fra(p,pAVar4,local_40);
        pAVar5 = Aig_And(p_00,pAVar5,p1);
        Ssw_ObjSetFrame(p,pAVar4,local_40,pAVar5);
        Ssw_FramesConstrainNode(p,p_00,p->pAig,pAVar4,local_40,1);
      }
    }
    for (iLits = 0; iVar2 = Vec_PtrSize(p->pAig->vCos), iLits < iVar2; iLits = iLits + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,iLits);
      pAVar5 = Ssw_ObjChild0Fra(p,pAVar4,local_40);
      Ssw_ObjSetFrame(p,pAVar4,local_40,pAVar5);
    }
    for (iLits = 0; iVar2 = Saig_ManRegNum(p->pAig), iLits < iVar2; iLits = iLits + 1) {
      pAVar4 = Saig_ManLi(p->pAig,iLits);
      pAVar5 = Saig_ManLo(p->pAig,iLits);
      pAVar4 = Ssw_ObjFrame(p,pAVar4,local_40);
      Ssw_ObjSetFrame(p,pAVar5,local_40 + 1,pAVar4);
    }
  }
  if (p->vInits != (Vec_Int_t *)0x0) {
    iVar2 = Vec_IntSize(p->vInits);
    iVar3 = Saig_ManPiNum(p->pAig);
    if (iVar2 != local_44 + iVar3) {
      __assert_fail("p->vInits == NULL || Vec_IntSize(p->vInits) == iLits + Saig_ManPiNum(p->pAig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                    ,0xbc,"Aig_Man_t *Ssw_FramesWithClasses(Ssw_Man_t *)");
    }
  }
  for (iLits = 0; iVar2 = Saig_ManRegNum(p->pAig), iLits < iVar2; iLits = iLits + 1) {
    pVVar1 = p->pAig->vCis;
    iVar2 = Saig_ManPiNum(p->pAig);
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,iLits + iVar2);
    pAVar4 = Ssw_ObjFrame(p,pAVar4,p->pPars->nFramesK);
    Aig_ObjCreateCo(p_00,pAVar4);
  }
  Aig_ManCleanup(p_00);
  if (p_00->pData == (void *)0x0) {
    return p_00;
  }
  __assert_fail("pFrames->pData == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                ,0xc4,"Aig_Man_t *Ssw_FramesWithClasses(Ssw_Man_t *)");
}

Assistant:

Aig_Man_t * Ssw_FramesWithClasses( Ssw_Man_t * p )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjNew;
    int i, f, iLits;
    assert( p->pFrames == NULL );
    assert( Aig_ManRegNum(p->pAig) > 0 );
    assert( Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig) );
    p->nConstrTotal = p->nConstrReduced = 0;

    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * p->nFrames );
    // create latches for the first frame
    Saig_ManForEachLo( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, 0, Aig_ObjCreateCi(pFrames) );
    // add timeframes
    iLits = 0;
    for ( f = 0; f < p->pPars->nFramesK; f++ )
    {
        // map constants and PIs
        Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(pFrames) );
        Saig_ManForEachPi( p->pAig, pObj, i )
        {
            pObjNew = Aig_ObjCreateCi(pFrames);
            pObjNew->fPhase = (p->vInits != NULL) && Vec_IntEntry(p->vInits, iLits++);
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
        }
        // set the constraints on the latch outputs
        Saig_ManForEachLo( p->pAig, pObj, i )
            Ssw_FramesConstrainNode( p, pFrames, p->pAig, pObj, f, 1 );
        // add internal nodes of this frame
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            pObjNew = Aig_And( pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            Ssw_FramesConstrainNode( p, pFrames, p->pAig, pObj, f, 1 );
        }
        // transfer to the primary outputs
        Aig_ManForEachCo( p->pAig, pObj, i )
            Ssw_ObjSetFrame( p, pObj, f, Ssw_ObjChild0Fra(p, pObj,f) );
        // transfer latch input to the latch outputs
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
            Ssw_ObjSetFrame( p, pObjLo, f+1, Ssw_ObjFrame(p, pObjLi,f) );
    }
    assert( p->vInits == NULL || Vec_IntSize(p->vInits) == iLits + Saig_ManPiNum(p->pAig) );
    // add the POs for the latch outputs of the last frame
    Saig_ManForEachLo( p->pAig, pObj, i )
        Aig_ObjCreateCo( pFrames, Ssw_ObjFrame( p, pObj, p->pPars->nFramesK ) );

    // remove dangling nodes
    Aig_ManCleanup( pFrames );
    // make sure the satisfying assignment is node assigned
    assert( pFrames->pData == NULL );
//Aig_ManShow( pFrames, 0, NULL );
    return pFrames;
}